

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

float predict_and_gradient(vw *all,example *ec)

{
  float fVar1;
  float loss_grad;
  float local_14;
  
  fVar1 = GD::inline_predict(all,ec);
  ec->partial_prediction = fVar1;
  fVar1 = GD::finalize_prediction(all->sd,fVar1);
  (*all->set_minmax)(all->sd,(ec->l).simple.label);
  (*all->loss->_vptr_loss_function[6])(fVar1,(ec->l).simple.label,all->loss,all->sd);
  GD::foreach_feature<float,_float_&,_&add_grad>(all,ec,&local_14);
  return fVar1;
}

Assistant:

float predict_and_gradient(vw& all, example& ec)
{
  float fp = bfgs_predict(all, ec);
  label_data& ld = ec.l.simple;
  all.set_minmax(all.sd, ld.label);

  float loss_grad = all.loss->first_derivative(all.sd, fp, ld.label) * ec.weight;
  GD::foreach_feature<float, add_grad>(all, ec, loss_grad);

  return fp;
}